

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  Type *this;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  SignalEventControl *ctrl;
  Symbol *pSVar4;
  Diagnostic *pDVar5;
  TimingControl *pTVar6;
  SourceLocation SVar7;
  TimingControl *extraout_RDX;
  TimingControl *extraout_RDX_00;
  TimingControl *extraout_RDX_01;
  TimingControl *extraout_RDX_02;
  DiagCode code;
  ClockingEventExpression *cee;
  SourceRange sourceRange_00;
  EdgeKind edge_local;
  Expression *iffCondition_local;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  SourceLocation SVar8;
  
  edge_local = edge;
  iffCondition_local = iffCondition;
  ctrl = BumpAllocator::
         emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                   (&compilation->super_BumpAllocator,&edge_local,expr,&iffCondition_local,
                    &sourceRange);
  bVar1 = Expression::bad(expr);
  if (bVar1) goto LAB_002c7eeb;
  pSVar4 = Expression::getSymbolReference(expr,true);
  if ((pSVar4 == (Symbol *)0x0) || (bVar1 = true, pSVar4->kind != ClockingBlock)) {
    bVar1 = expr->kind == ClockingEvent;
  }
  this = (expr->type).ptr;
  if (edge_local == None) {
    bVar2 = Type::isAggregate(this);
    if (((!bVar2) && (bVar2 = Type::isPropertyType((expr->type).ptr), !bVar2)) &&
       (bVar2 = Type::isVoid((expr->type).ptr), pTVar6 = extraout_RDX_01,
       (~bVar2 & 1U) != 0 || bVar1)) goto LAB_002c7e5e;
    SVar8 = (expr->sourceRange).startLoc;
    SVar7 = (expr->sourceRange).endLoc;
    code.subsystem = Statements;
    code.code = 0x24;
  }
  else {
    bVar2 = Type::isIntegral(this);
    if (bVar2) {
      bVar3 = Type::getBitWidth((expr->type).ptr);
      pTVar6 = extraout_RDX;
      if (1 < bVar3) {
        pDVar5 = ASTContext::addDiag(context,(DiagCode)0x5b0008,expr->sourceRange);
        ast::operator<<(pDVar5,(expr->type).ptr);
        pTVar6 = extraout_RDX_00;
      }
LAB_002c7e5e:
      if (iffCondition_local == (Expression *)0x0) {
LAB_002c7e93:
        if (expr->kind == ClockingEvent) {
          pTVar6 = cloneClockingEvent((ast *)compilation,*(Compilation **)(expr + 1),pTVar6);
          return pTVar6;
        }
        ASTContext::tryEval((ConstantValue *)&local_50,context,expr);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_50);
        if (local_50._M_index == '\0') {
          return &ctrl->super_TimingControl;
        }
        ASTContext::addDiag(context,(DiagCode)0x5a0008,expr->sourceRange);
        return &ctrl->super_TimingControl;
      }
      if (bVar1) {
        ASTContext::addDiag(context,(DiagCode)0xd0008,iffCondition_local->sourceRange);
      }
      bVar1 = ASTContext::requireBooleanConvertible(context,iffCondition_local);
      pTVar6 = extraout_RDX_02;
      if (bVar1) goto LAB_002c7e93;
      goto LAB_002c7eeb;
    }
    SVar8 = (expr->sourceRange).startLoc;
    SVar7 = (expr->sourceRange).endLoc;
    if (bVar1) {
      ASTContext::addDiag(context,(DiagCode)0xc0008,expr->sourceRange);
      goto LAB_002c7eeb;
    }
    code.subsystem = Expressions;
    code.code = 0x55;
  }
  sourceRange_00.endLoc = SVar7;
  sourceRange_00.startLoc = SVar8;
  pDVar5 = ASTContext::addDiag(context,code,sourceRange_00);
  ast::operator<<(pDVar5,(expr->type).ptr);
LAB_002c7eeb:
  pTVar6 = TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  return pTVar6;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed ArbitrarySymbolExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    const bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                            expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }
    else if (expr.type->getBitWidth() > 1) {
        context.addDiag(diag::MultiBitEdge, expr.sourceRange) << *expr.type;
    }

    if (iffCondition) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventIff, iffCondition->sourceRange);

        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // If our expression is a reference to another clocking event due to
    // a sequence or property argument expansion we need to unwrap to the
    // target timing control and use that instead.
    if (expr.kind == ExpressionKind::ClockingEvent) {
        auto& cee = expr.as<ClockingEventExpression>();
        return cloneClockingEvent(compilation, cee.timingControl);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}